

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerAdapter.cxx
# Opt level: O2

void __thiscall
cmDebugger::cmDebuggerAdapter::OnMessageOutput(cmDebuggerAdapter *this,MessageType t,string *text)

{
  optional<dap::StoppedEvent> stoppedEvent;
  _Optional_payload_base<dap::StoppedEvent> _Stack_c8;
  
  cmDebuggerExceptionManager::RaiseExceptionIfAny
            ((optional<dap::StoppedEvent> *)&_Stack_c8,
             (this->ExceptionManager)._M_t.
             super___uniq_ptr_impl<cmDebugger::cmDebuggerExceptionManager,_std::default_delete<cmDebugger::cmDebuggerExceptionManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmDebugger::cmDebuggerExceptionManager_*,_std::default_delete<cmDebugger::cmDebuggerExceptionManager>_>
             .super__Head_base<0UL,_cmDebugger::cmDebuggerExceptionManager_*,_false>._M_head_impl,t,
             text);
  if (_Stack_c8._M_engaged == true) {
    _Stack_c8._M_payload._M_value.threadId.val.val =
         (integer)((this->DefaultThread).
                   super___shared_ptr<cmDebugger::cmDebuggerThread,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->Id;
    _Stack_c8._M_payload._M_value.threadId.set = true;
    dap::Session::send<dap::StoppedEvent,void>
              ((this->Session)._M_t.
               super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
               super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
               super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl,(StoppedEvent *)&_Stack_c8)
    ;
    Semaphore::Wait((this->ContinueSem)._M_t.
                    super___uniq_ptr_impl<cmDebugger::Semaphore,_std::default_delete<cmDebugger::Semaphore>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmDebugger::Semaphore_*,_std::default_delete<cmDebugger::Semaphore>_>
                    .super__Head_base<0UL,_cmDebugger::Semaphore_*,_false>._M_head_impl);
  }
  std::_Optional_payload_base<dap::StoppedEvent>::_M_reset(&_Stack_c8);
  return;
}

Assistant:

void cmDebuggerAdapter::OnMessageOutput(MessageType t, std::string const& text)
{
  cm::optional<dap::StoppedEvent> stoppedEvent =
    ExceptionManager->RaiseExceptionIfAny(t, text);
  if (stoppedEvent.has_value()) {
    stoppedEvent->threadId = DefaultThread->GetId();
    Session->send(*stoppedEvent);
    ContinueSem->Wait();
  }
}